

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotCreateUpdateForm.cpp
# Opt level: O2

Slot * __thiscall SlotCreateUpdateForm::save(SlotCreateUpdateForm *this)

{
  int iVar1;
  Slot *pSVar2;
  Slot *this_00;
  
  this_00 = (Slot *)operator_new(0x970);
  Slot::Slot(this_00,&this->requestedBy,&this->room,&this->startTime,&this->endTime,this->reason,
             this->approved);
  pSVar2 = (this->super_ModelForm<Slot>).instance;
  if (pSVar2 != (Slot *)0x0) {
    iVar1 = (pSVar2->super_Model<Slot>).id;
    (*(pSVar2->super_Model<Slot>)._vptr_Model[1])();
    (this_00->super_Model<Slot>).id = iVar1;
  }
  (**(this_00->super_Model<Slot>)._vptr_Model)(this_00);
  return this_00;
}

Assistant:

Slot &SlotCreateUpdateForm::save() {
    Slot *temp;
    temp = new Slot(requestedBy, room, startTime, endTime, reason, approved);
    if (instance) {
        int id = instance->getId();
        instance->remove();
        temp->setId(id);
    }
    temp->save();
    return *temp;
}